

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall
kj::_::NetworkFilter::NetworkFilter
          (NetworkFilter *this,ArrayPtr<const_kj::StringPtr> allow,
          ArrayPtr<const_kj::StringPtr> deny,NetworkFilter *next)

{
  Vector<kj::CidrRange> *this_00;
  Vector<kj::CidrRange> *this_01;
  RemoveConst<kj::CidrRange> **ppRVar1;
  long *plVar2;
  size_t sVar3;
  CidrRange *pCVar4;
  ArrayPtr<const_char> AVar5;
  int iVar6;
  CidrRange *pCVar7;
  ArrayPtr<const_char> *pAVar8;
  ArrayPtr<const_char> *pAVar9;
  RemoveConst<kj::CidrRange> *pRVar10;
  ArrayPtr<const_char> *pAVar11;
  long lVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  ArrayPtr<const_kj::CidrRange> AVar16;
  Fault f;
  CidrRange local_50;
  ArrayPtr<const_char> *local_38;
  
  pAVar8 = &(deny.ptr)->content;
  pAVar11 = &(allow.ptr)->content;
  (this->super_NetworkFilter)._vptr_NetworkFilter = (_func_int **)&PTR_shouldAllow_00621030;
  this_00 = &this->allowCidrs;
  (this->allowCidrs).builder.ptr = (CidrRange *)0x0;
  (this->allowCidrs).builder.pos = (RemoveConst<kj::CidrRange> *)0x0;
  (this->allowCidrs).builder.endPtr = (CidrRange *)0x0;
  (this->allowCidrs).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  this_01 = &this->denyCidrs;
  (this->denyCidrs).builder.ptr = (CidrRange *)0x0;
  (this->denyCidrs).builder.pos = (RemoveConst<kj::CidrRange> *)0x0;
  (this->denyCidrs).builder.endPtr = (CidrRange *)0x0;
  (this->denyCidrs).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  this->allowUnix = false;
  this->allowAbstractUnix = false;
  this->allowPublic = false;
  this->allowNetwork = false;
  (this->next).ptr = next;
  if (allow.size_ != 0) {
    pAVar9 = pAVar11 + allow.size_;
    local_38 = pAVar9;
    do {
      plVar2 = (long *)pAVar11->ptr;
      sVar3 = pAVar11->size_;
      AVar5 = *pAVar11;
      switch(sVar3) {
      case 5:
        iVar6 = bcmp(plVar2,"unix",sVar3);
        if (iVar6 != 0) break;
        this->allowUnix = true;
        goto LAB_00409854;
      case 6:
        if (*(short *)((long)plVar2 + 4) == 0x6c && (int)*plVar2 == 0x61636f6c) {
          AVar16 = localCidrs();
          pCVar7 = (this->allowCidrs).builder.ptr;
          pRVar10 = (this->allowCidrs).builder.pos;
          uVar15 = ((long)pRVar10 - (long)pCVar7 >> 3) * -0x5555555555555555 + AVar16.size_;
          pCVar4 = (this->allowCidrs).builder.endPtr;
          lVar12 = (long)pCVar4 - (long)pCVar7 >> 3;
          if ((ulong)(lVar12 * -0x5555555555555555) < uVar15) {
            uVar13 = lVar12 * 0x5555555555555556;
            if (pCVar4 == pCVar7) {
              uVar13 = 4;
            }
            if (uVar13 < uVar15) {
              uVar13 = uVar15;
            }
            Vector<kj::CidrRange>::setCapacity(this_00,uVar13);
LAB_004097a9:
            pRVar10 = (this->allowCidrs).builder.pos;
          }
LAB_004097ad:
          sVar14 = AVar16.size_;
          if (sVar14 != 0) {
            memcpy(pRVar10,AVar16.ptr,sVar14 * 0x18);
          }
          (this->allowCidrs).builder.pos = pRVar10 + sVar14;
          pAVar9 = local_38;
          goto LAB_00409854;
        }
        break;
      case 7:
        iVar6 = bcmp(plVar2,"public",sVar3);
        if (iVar6 == 0) {
          this->allowPublic = true;
          goto LAB_00409854;
        }
        break;
      case 8:
        iVar6 = bcmp(plVar2,"network",sVar3);
        if (iVar6 == 0) {
          this->allowNetwork = true;
          goto LAB_00409854;
        }
        if (*plVar2 == 0x65746176697270) {
          AVar16 = privateCidrs();
          sVar14 = AVar16.size_;
          pCVar7 = (this->allowCidrs).builder.ptr;
          pRVar10 = (this->allowCidrs).builder.pos;
          uVar15 = ((long)pRVar10 - (long)pCVar7 >> 3) * -0x5555555555555555 + sVar14;
          pCVar4 = (this->allowCidrs).builder.endPtr;
          lVar12 = (long)pCVar4 - (long)pCVar7 >> 3;
          if ((ulong)(lVar12 * -0x5555555555555555) < uVar15) {
            uVar13 = lVar12 * 0x5555555555555556;
            if (pCVar4 == pCVar7) {
              uVar13 = 4;
            }
            if (uVar13 < uVar15) {
              uVar13 = uVar15;
            }
            Vector<kj::CidrRange>::setCapacity(this_00,uVar13);
            pRVar10 = (this->allowCidrs).builder.pos;
          }
          if (sVar14 != 0) {
            memcpy(pRVar10,AVar16.ptr,sVar14 * 0x18);
          }
          (this->allowCidrs).builder.pos = pRVar10 + sVar14;
          AVar16 = localCidrs();
          pCVar7 = (this->allowCidrs).builder.ptr;
          pRVar10 = (this->allowCidrs).builder.pos;
          uVar15 = ((long)pRVar10 - (long)pCVar7 >> 3) * -0x5555555555555555 + AVar16.size_;
          pCVar4 = (this->allowCidrs).builder.endPtr;
          lVar12 = (long)pCVar4 - (long)pCVar7 >> 3;
          if ((ulong)(lVar12 * -0x5555555555555555) < uVar15) {
            uVar13 = lVar12 * 0x5555555555555556;
            if (pCVar4 == pCVar7) {
              uVar13 = 4;
            }
            if (uVar13 < uVar15) {
              uVar13 = uVar15;
            }
            Vector<kj::CidrRange>::setCapacity(this_00,uVar13);
            goto LAB_004097a9;
          }
          goto LAB_004097ad;
        }
        break;
      case 0xe:
        iVar6 = bcmp(plVar2,"unix-abstract",sVar3);
        if (iVar6 == 0) {
          this->allowAbstractUnix = true;
          goto LAB_00409854;
        }
      }
      CidrRange::CidrRange(&local_50,(StringPtr)AVar5);
      pCVar7 = (this->allowCidrs).builder.pos;
      if (pCVar7 == (this->allowCidrs).builder.endPtr) {
        pCVar4 = (this_00->builder).ptr;
        sVar14 = ((long)pCVar7 - (long)pCVar4 >> 3) * 0x5555555555555556;
        if (pCVar7 == pCVar4) {
          sVar14 = 4;
        }
        Vector<kj::CidrRange>::setCapacity(this_00,sVar14);
        pCVar7 = (this->allowCidrs).builder.pos;
      }
      *(undefined8 *)(pCVar7->bits + 0xc) = local_50._16_8_;
      pCVar7->family = local_50.family;
      pCVar7->bits[0] = local_50.bits[0];
      pCVar7->bits[1] = local_50.bits[1];
      pCVar7->bits[2] = local_50.bits[2];
      pCVar7->bits[3] = local_50.bits[3];
      *(undefined8 *)(pCVar7->bits + 4) = local_50.bits._4_8_;
      ppRVar1 = &(this->allowCidrs).builder.pos;
      *ppRVar1 = *ppRVar1 + 1;
LAB_00409854:
      pAVar11 = pAVar11 + 1;
    } while (pAVar11 != pAVar9);
  }
  if (deny.size_ != 0) {
    pAVar11 = pAVar8 + deny.size_;
    do {
      plVar2 = (long *)pAVar8->ptr;
      sVar3 = pAVar8->size_;
      AVar5 = *pAVar8;
      switch(sVar3) {
      case 5:
        iVar6 = bcmp(plVar2,"unix",sVar3);
        if (iVar6 != 0) break;
        this->allowUnix = false;
        goto LAB_00409ac2;
      case 6:
        if (*(short *)((long)plVar2 + 4) == 0x6c && (int)*plVar2 == 0x61636f6c) {
          AVar16 = localCidrs();
          pCVar7 = (this->denyCidrs).builder.ptr;
          pRVar10 = (this->denyCidrs).builder.pos;
          uVar15 = ((long)pRVar10 - (long)pCVar7 >> 3) * -0x5555555555555555 + AVar16.size_;
          pCVar4 = (this->denyCidrs).builder.endPtr;
          lVar12 = (long)pCVar4 - (long)pCVar7 >> 3;
          if ((ulong)(lVar12 * -0x5555555555555555) < uVar15) {
            uVar13 = lVar12 * 0x5555555555555556;
            if (pCVar4 == pCVar7) {
              uVar13 = 4;
            }
            if (uVar13 < uVar15) {
              uVar13 = uVar15;
            }
            Vector<kj::CidrRange>::setCapacity(this_01,uVar13);
LAB_00409a14:
            pRVar10 = (this->denyCidrs).builder.pos;
          }
LAB_00409a18:
          sVar14 = AVar16.size_;
          if (sVar14 != 0) {
            memcpy(pRVar10,AVar16.ptr,sVar14 * 0x18);
          }
          (this->denyCidrs).builder.pos = pRVar10 + sVar14;
          goto LAB_00409ac2;
        }
        break;
      case 7:
        iVar6 = bcmp(plVar2,"public",sVar3);
        if (iVar6 == 0) {
          Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                    ((Fault *)&local_50,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                     ,0xc2d,FAILED,(char *)0x0,
                     "\"don\'t deny \'public\', allow \'private\' instead\"",
                     (char (*) [45])"don\'t deny \'public\', allow \'private\' instead");
          Debug::Fault::fatal((Fault *)&local_50);
        }
        break;
      case 8:
        iVar6 = bcmp(plVar2,"network",sVar3);
        if (iVar6 == 0) {
          Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                    ((Fault *)&local_50,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                     ,0xc28,FAILED,(char *)0x0,
                     "\"don\'t deny \'network\', allow \'local\' instead\"",
                     (char (*) [44])"don\'t deny \'network\', allow \'local\' instead");
          Debug::Fault::fatal((Fault *)&local_50);
        }
        if (*plVar2 == 0x65746176697270) {
          AVar16 = privateCidrs();
          pCVar7 = (this->denyCidrs).builder.ptr;
          pRVar10 = (this->denyCidrs).builder.pos;
          uVar15 = ((long)pRVar10 - (long)pCVar7 >> 3) * -0x5555555555555555 + AVar16.size_;
          pCVar4 = (this->denyCidrs).builder.endPtr;
          lVar12 = (long)pCVar4 - (long)pCVar7 >> 3;
          if ((ulong)(lVar12 * -0x5555555555555555) < uVar15) {
            uVar13 = lVar12 * 0x5555555555555556;
            if (pCVar4 == pCVar7) {
              uVar13 = 4;
            }
            if (uVar13 < uVar15) {
              uVar13 = uVar15;
            }
            Vector<kj::CidrRange>::setCapacity(this_01,uVar13);
            goto LAB_00409a14;
          }
          goto LAB_00409a18;
        }
        break;
      case 0xe:
        iVar6 = bcmp(plVar2,"unix-abstract",sVar3);
        if (iVar6 == 0) {
          this->allowAbstractUnix = false;
          goto LAB_00409ac2;
        }
      }
      CidrRange::CidrRange(&local_50,(StringPtr)AVar5);
      pCVar7 = (this->denyCidrs).builder.pos;
      if (pCVar7 == (this->denyCidrs).builder.endPtr) {
        pCVar4 = (this_01->builder).ptr;
        sVar14 = ((long)pCVar7 - (long)pCVar4 >> 3) * 0x5555555555555556;
        if (pCVar7 == pCVar4) {
          sVar14 = 4;
        }
        Vector<kj::CidrRange>::setCapacity(this_01,sVar14);
        pCVar7 = (this->denyCidrs).builder.pos;
      }
      *(undefined8 *)(pCVar7->bits + 0xc) = local_50._16_8_;
      pCVar7->family = local_50.family;
      pCVar7->bits[0] = local_50.bits[0];
      pCVar7->bits[1] = local_50.bits[1];
      pCVar7->bits[2] = local_50.bits[2];
      pCVar7->bits[3] = local_50.bits[3];
      *(undefined8 *)(pCVar7->bits + 4) = local_50.bits._4_8_;
      ppRVar1 = &(this->denyCidrs).builder.pos;
      *ppRVar1 = *ppRVar1 + 1;
LAB_00409ac2:
      pAVar8 = pAVar8 + 1;
    } while (pAVar8 != pAVar11);
  }
  return;
}

Assistant:

NetworkFilter::NetworkFilter(ArrayPtr<const StringPtr> allow, ArrayPtr<const StringPtr> deny,
                             NetworkFilter& next)
    : allowUnix(false), allowAbstractUnix(false), next(next) {
  for (auto rule: allow) {
    if (rule == "local") {
      allowCidrs.addAll(localCidrs());
    } else if (rule == "network") {
      // Can't be represented as a simple union of CIDRs, so we handle in shouldAllow().
      allowNetwork = true;
    } else if (rule == "private") {
      allowCidrs.addAll(privateCidrs());
      allowCidrs.addAll(localCidrs());
    } else if (rule == "public") {
      // Can't be represented as a simple union of CIDRs, so we handle in shouldAllow().
      allowPublic = true;
    } else if (rule == "unix") {
      allowUnix = true;
    } else if (rule == "unix-abstract") {
      allowAbstractUnix = true;
    } else {
      allowCidrs.add(CidrRange(rule));
    }
  }

  for (auto rule: deny) {
    if (rule == "local") {
      denyCidrs.addAll(localCidrs());
    } else if (rule == "network") {
      KJ_FAIL_REQUIRE("don't deny 'network', allow 'local' instead");
    } else if (rule == "private") {
      denyCidrs.addAll(privateCidrs());
    } else if (rule == "public") {
      // Tricky: What if we allow 'network' and deny 'public'?
      KJ_FAIL_REQUIRE("don't deny 'public', allow 'private' instead");
    } else if (rule == "unix") {
      allowUnix = false;
    } else if (rule == "unix-abstract") {
      allowAbstractUnix = false;
    } else {
      denyCidrs.add(CidrRange(rule));
    }
  }
}